

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

BaseNode * __thiscall asmjit::BaseBuilder::addBefore(BaseBuilder *this,BaseNode *node,BaseNode *ref)

{
  byte bVar1;
  BaseNode *pBVar2;
  BaseNode **ppBVar3;
  
  if (node == (BaseNode *)0x0) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/builder.cpp"
               ,0xec,"node != nullptr");
  }
  if ((node->field_0).field_0._prev != (BaseNode *)0x0) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/builder.cpp"
               ,0xed,"!node->_prev");
  }
  if ((node->field_0).field_0._next != (BaseNode *)0x0) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/builder.cpp"
               ,0xee,"!node->_next");
  }
  bVar1 = (node->field_1)._any._nodeFlags;
  if (-1 < (char)bVar1) {
    if (ref == (BaseNode *)0x0) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/builder.cpp"
                 ,0xf0,"ref != nullptr");
    }
    if ((char)(ref->field_1)._any._nodeFlags < '\0') {
      pBVar2 = (ref->field_0).field_0._prev;
      (node->field_0).field_0._prev = pBVar2;
      (node->field_0).field_0._next = ref;
      (node->field_1)._any._nodeFlags = bVar1 | 0x80;
      if ((node->field_1)._any._nodeType == '\x02') {
        this->_dirtySectionLinks = true;
      }
      (ref->field_0).field_0._prev = node;
      ppBVar3 = &(pBVar2->field_0).field_0._next;
      if (pBVar2 == (BaseNode *)0x0) {
        ppBVar3 = &this->_firstNode;
      }
      *ppBVar3 = node;
      return node;
    }
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/builder.cpp"
               ,0xf1,"ref->isActive()");
  }
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/builder.cpp"
             ,0xef,"!node->isActive()");
}

Assistant:

BaseNode* BaseBuilder::addBefore(BaseNode* node, BaseNode* ref) noexcept {
  ASMJIT_ASSERT(node != nullptr);
  ASMJIT_ASSERT(!node->_prev);
  ASMJIT_ASSERT(!node->_next);
  ASMJIT_ASSERT(!node->isActive());
  ASMJIT_ASSERT(ref != nullptr);
  ASMJIT_ASSERT(ref->isActive());

  BaseNode* prev = ref->prev();
  BaseNode* next = ref;

  node->_prev = prev;
  node->_next = next;

  node->addFlags(BaseNode::kFlagIsActive);
  if (node->isSection())
    _dirtySectionLinks = true;

  next->_prev = node;
  if (prev)
    prev->_next = node;
  else
    _firstNode = node;

  return node;
}